

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O2

void __thiscall testing::internal::String::String(String *this,char *a_c_str)

{
  size_t a_length;
  
  if (a_c_str != (char *)0x0) {
    a_length = strlen(a_c_str);
    ConstructNonNull(this,a_c_str,a_length);
    return;
  }
  this->c_str_ = (char *)0x0;
  this->length_ = 0;
  return;
}

Assistant:

String(const char* a_c_str) {  // NOLINT
    if (a_c_str == NULL) {
      c_str_ = NULL;
      length_ = 0;
    } else {
      ConstructNonNull(a_c_str, strlen(a_c_str));
    }
  }